

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

bool llb_buildsystem_command_interface_spawn
               (llb_task_interface_t ti,llb_buildsystem_queue_job_context_t *job_context,char **args
               ,int32_t arg_count,char **env_keys,char **env_values,int32_t env_count,
               llb_data_t *working_dir,llb_buildsystem_spawn_delegate_t *delegate)

{
  ProcessAttributes attributes;
  pointer this;
  ForwardingProcessDelegate *this_00;
  size_t local_228;
  ProcessResult local_208;
  function<void_(llbuild::basic::ProcessResult)> local_1e0;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> local_1c0;
  undefined1 local_198;
  undefined1 uStack_197;
  undefined6 uStack_196;
  uint8_t *local_190;
  void *local_188;
  undefined1 local_180;
  undefined1 uStack_17f;
  undefined6 uStack_17e;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> local_178;
  ArrayRef<llvm::StringRef> local_168;
  ForwardingProcessDelegate *local_158;
  ForwardingProcessDelegate *forwardingDelegate;
  anon_class_8_1_54a39810 commandCompletionFn;
  future<llbuild::basic::ProcessResult> result;
  promise<llbuild::basic::ProcessResult> p;
  StringRef local_110;
  pair<llvm::StringRef,_llvm::StringRef> local_100;
  int local_dc;
  undefined1 local_d8 [4];
  int32_t i_1;
  vector<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
  environment;
  int local_ac;
  undefined1 local_a8 [4];
  int32_t i;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> arguments;
  TaskInterface *coreti;
  char **env_keys_local;
  int32_t arg_count_local;
  char **args_local;
  llb_buildsystem_queue_job_context_t *job_context_local;
  llb_task_interface_t ti_local;
  
  ti_local.impl = ti.ctx;
  job_context_local = (llb_buildsystem_queue_job_context_t *)ti.impl;
  arguments.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&job_context_local;
  memset(local_a8,0,0x18);
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::vector
            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_a8);
  for (local_ac = 0; local_ac < arg_count; local_ac = local_ac + 1) {
    environment.
    super__Vector_base<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)args[local_ac];
    if (environment.
        super__Vector_base<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      strlen((char *)environment.
                     super__Vector_base<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
              ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_a8,
               (value_type *)
               &environment.
                super__Vector_base<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  memset(local_d8,0,0x18);
  std::
  vector<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
  ::vector((vector<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
            *)local_d8);
  for (local_dc = 0; local_dc < env_count; local_dc = local_dc + 1) {
    local_110.Data = env_keys[local_dc];
    if (local_110.Data == (char *)0x0) {
      local_228 = 0;
    }
    else {
      local_228 = strlen(local_110.Data);
    }
    local_110.Length = local_228;
    p._M_storage._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<llbuild::basic::ProcessResult>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<llbuild::basic::ProcessResult>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<llbuild::basic::ProcessResult>_*,_false>.
    _M_head_impl = *(__uniq_ptr_data<std::__future_base::_Result<llbuild::basic::ProcessResult>,_std::__future_base::_Result_base::_Deleter,_true,_true>
                     *)&((_Tuple_impl<0UL,_std::__future_base::_Result<llbuild::basic::ProcessResult>_*,_std::__future_base::_Result_base::_Deleter>
                          *)(env_values + local_dc))->
                        super__Head_base<0UL,_std::__future_base::_Result<llbuild::basic::ProcessResult>_*,_false>
    ;
    if ((tuple<std::__future_base::_Result<llbuild::basic::ProcessResult>_*,_std::__future_base::_Result_base::_Deleter>
         )p._M_storage._M_t.
          super___uniq_ptr_impl<std::__future_base::_Result<llbuild::basic::ProcessResult>,_std::__future_base::_Result_base::_Deleter>
          ._M_t.
          super__Tuple_impl<0UL,_std::__future_base::_Result<llbuild::basic::ProcessResult>_*,_std::__future_base::_Result_base::_Deleter>
          .
          super__Head_base<0UL,_std::__future_base::_Result<llbuild::basic::ProcessResult>_*,_false>
          ._M_head_impl !=
        (_Head_base<0UL,_std::__future_base::_Result<llbuild::basic::ProcessResult>_*,_false>)0x0) {
      strlen((char *)p._M_storage._M_t.
                     super___uniq_ptr_impl<std::__future_base::_Result<llbuild::basic::ProcessResult>,_std::__future_base::_Result_base::_Deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__future_base::_Result<llbuild::basic::ProcessResult>_*,_std::__future_base::_Result_base::_Deleter>
                     .
                     super__Head_base<0UL,_std::__future_base::_Result<llbuild::basic::ProcessResult>_*,_false>
                     ._M_head_impl);
    }
    std::pair<llvm::StringRef,_llvm::StringRef>::pair<llvm::StringRef,_llvm::StringRef,_true>
              (&local_100,&local_110,(StringRef *)&p._M_storage);
    std::
    vector<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
    ::push_back((vector<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
                 *)local_d8,&local_100);
  }
  std::promise<llbuild::basic::ProcessResult>::promise
            ((promise<llbuild::basic::ProcessResult> *)
             &result.super___basic_future<llbuild::basic::ProcessResult>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<llbuild::basic::ProcessResult>::get_future
            ((promise<llbuild::basic::ProcessResult> *)&commandCompletionFn);
  forwardingDelegate =
       (ForwardingProcessDelegate *)
       &result.super___basic_future<llbuild::basic::ProcessResult>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount;
  this_00 = (ForwardingProcessDelegate *)operator_new(0x10);
  llb_buildsystem_command_interface_spawn::ForwardingProcessDelegate::ForwardingProcessDelegate
            (this_00,delegate);
  this = arguments.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  local_158 = this_00;
  llvm::ArrayRef<llvm::StringRef>::ArrayRef<std::allocator<llvm::StringRef>>
            (&local_168,(vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_a8);
  llvm::ArrayRef<std::pair<llvm::StringRef,llvm::StringRef>>::
  ArrayRef<std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
            ((ArrayRef<std::pair<llvm::StringRef,llvm::StringRef>> *)&local_178,
             (vector<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
              *)local_d8);
  local_198 = 1;
  uStack_197 = 0;
  local_190 = working_dir->data;
  local_188 = (void *)working_dir->length;
  local_180 = 1;
  uStack_17f = 1;
  ti_local.ctx = local_188;
  std::function<void(llbuild::basic::ProcessResult)>::
  function<llb_buildsystem_command_interface_spawn::__0&,void>
            ((function<void(llbuild::basic::ProcessResult)> *)&local_1e0,
             (anon_class_8_1_54a39810 *)&forwardingDelegate);
  llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::Optional
            (&local_1c0,&local_1e0);
  attributes.connectToConsole = (bool)uStack_197;
  attributes.canSafelyInterrupt = (bool)local_198;
  attributes._2_6_ = uStack_196;
  attributes.controlEnabled = (bool)uStack_17f;
  attributes.inheritEnvironment = (bool)local_180;
  attributes._26_6_ = uStack_17e;
  attributes.workingDir.Data = (char *)local_190;
  attributes.workingDir.Length = (size_t)local_188;
  llbuild::core::TaskInterface::spawn
            ((TaskInterface *)this,(QueueJobContext *)job_context,local_168,local_178,attributes,
             &local_1c0,&local_158->super_ProcessDelegate);
  llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::~Optional(&local_1c0);
  std::function<void_(llbuild::basic::ProcessResult)>::~function(&local_1e0);
  if (local_158 != (ForwardingProcessDelegate *)0x0) {
    (*(local_158->super_ProcessDelegate)._vptr_ProcessDelegate[1])();
  }
  std::future<llbuild::basic::ProcessResult>::get
            (&local_208,(future<llbuild::basic::ProcessResult> *)&commandCompletionFn);
  std::future<llbuild::basic::ProcessResult>::~future
            ((future<llbuild::basic::ProcessResult> *)&commandCompletionFn);
  std::promise<llbuild::basic::ProcessResult>::~promise
            ((promise<llbuild::basic::ProcessResult> *)
             &result.super___basic_future<llbuild::basic::ProcessResult>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
  ::~vector((vector<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
             *)local_d8);
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector
            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_a8);
  return local_208.status == Succeeded;
}

Assistant:

bool llb_buildsystem_command_interface_spawn(llb_task_interface_t ti, llb_buildsystem_queue_job_context_t *job_context, const char * const*args, int32_t arg_count, const char * const *env_keys, const char * const *env_values, int32_t env_count, llb_data_t *working_dir, llb_buildsystem_spawn_delegate_t *delegate) {
  auto coreti = reinterpret_cast<core::TaskInterface*>(&ti);
  auto arguments = std::vector<StringRef>();
  for (int32_t i = 0; i < arg_count; i++) {
    arguments.push_back(StringRef(args[i]));
  }
  auto environment = std::vector<std::pair<StringRef, StringRef>>();
  for (int32_t i = 0; i < env_count; i++) {
    environment.push_back(std::pair<StringRef, StringRef>(StringRef(env_keys[i]), StringRef(env_values[i])));
  }
  
  std::promise<ProcessResult> p;
  auto result = p.get_future();
  auto commandCompletionFn = [&p](ProcessResult processResult) mutable {
    p.set_value(processResult);
  };
  
  class ForwardingProcessDelegate: public basic::ProcessDelegate {
    llb_buildsystem_spawn_delegate_t *delegate;
    
  public:
    ForwardingProcessDelegate(llb_buildsystem_spawn_delegate_t *delegate): delegate(delegate) {}
    
    virtual void processStarted(ProcessContext* ctx, ProcessHandle handle,
                                llbuild_pid_t pid) {
      if (delegate != NULL) {
        delegate->process_started(delegate->context, pid);
      }
    }

    virtual void processHadError(ProcessContext* ctx, ProcessHandle handle,
                                 const Twine& message) {
      if (delegate != NULL) {
        auto errStr = message.str();
        llb_data_t err{ errStr.size(), (const uint8_t*) errStr.data() };
        delegate->process_had_error(delegate->context, &err);
      }
    };

    virtual void processHadOutput(ProcessContext* ctx, ProcessHandle handle,
                                  StringRef data) {
      if (delegate != NULL) {
        llb_data_t message{ data.size(), (const uint8_t*) data.data() };
        delegate->process_had_output(delegate->context, &message);
      }
    };

    virtual void processFinished(ProcessContext* ctx, ProcessHandle handle,
                                 const ProcessResult& result) {
      if (delegate != NULL) {
        llb_buildsystem_command_extended_result_t res;
        res.result = get_command_result(result.status);
        res.exit_status = result.exitCode;
        res.pid = result.pid;
        res.utime = result.utime;
        res.stime = result.stime;
        res.maxrss = result.maxrss;
        delegate->process_finished(delegate->context, &res);
      }
    }

  };

  auto forwardingDelegate = new ForwardingProcessDelegate(delegate);
  coreti->spawn((QueueJobContext*)job_context, ArrayRef<StringRef>(arguments), ArrayRef<std::pair<StringRef, StringRef>>(environment), {true, false, StringRef((const char*)working_dir->data, working_dir->length)}, {commandCompletionFn}, forwardingDelegate);

  delete forwardingDelegate;

  return result.get().status == ProcessStatus::Succeeded;  
}